

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromFloatAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  fltSemantics *pfVar3;
  Significand *pSVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  Significand *pSVar9;
  Significand SVar10;
  Significand SVar11;
  
  if (api->BitWidth != 0x20) {
    __assert_fail("api.getBitWidth()==32",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc60,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  uVar2 = (api->U).VAL;
  initialize(this,(fltSemantics *)semIEEEsingle);
  pfVar3 = this->semantics;
  if (0x3f < pfVar3->precision) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc66,"void llvm::detail::IEEEFloat::initFromFloatAPInt(const APInt &)");
  }
  uVar6 = uVar2 >> 0x17 & 0xff;
  bVar1 = this->field_0x12;
  bVar8 = (byte)(uVar2 >> 0x1c) & 8;
  iVar5 = (int)uVar6;
  if (iVar5 == 0 && (uVar2 & 0x7fffff) == 0) {
    bVar8 = bVar1 & 0xf0 | bVar8 | 3;
  }
  else {
    if (iVar5 != 0xff || (uVar2 & 0x7fffff) != 0) {
      bVar8 = bVar1 & 0xf0 | bVar8;
      if ((uVar2 & 0x7fffff) != 0 && iVar5 == 0xff) {
        this->field_0x12 = bVar8 | 1;
        SVar10._0_4_ = (uint)uVar2 & 0x7fffff;
        SVar10.part._4_4_ = 0;
        if (pfVar3->precision - 0x40 < 0xffffff80) {
          pSVar4 = (Significand *)(this->significand).parts;
        }
        else {
          pSVar4 = &this->significand;
        }
        *pSVar4 = SVar10;
        return;
      }
      this->field_0x12 = bVar8 | 2;
      this->exponent = (short)uVar6 + -0x7f;
      SVar11._0_4_ = (uint)uVar2 & 0x7fffff;
      SVar11.part._4_4_ = 0;
      uVar7 = pfVar3->precision - 0x40;
      pSVar4 = &this->significand;
      pSVar9 = pSVar4;
      if (uVar7 < 0xffffff80) {
        pSVar9 = (Significand *)(this->significand).parts;
      }
      *pSVar9 = SVar11;
      if (iVar5 != 0) {
        if (uVar7 < 0xffffff80) {
          pSVar4 = (Significand *)pSVar4->parts;
        }
        pSVar4->part = pSVar4->part | 0x800000;
        return;
      }
      this->exponent = -0x7e;
      return;
    }
    bVar8 = bVar1 & 0xf0 | bVar8;
  }
  this->field_0x12 = bVar8;
  return;
}

Assistant:

void IEEEFloat::initFromFloatAPInt(const APInt &api) {
  assert(api.getBitWidth()==32);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 23) & 0xff;
  uint32_t mysignificand = i & 0x7fffff;

  initialize(&semIEEEsingle);
  assert(partCount()==1);

  sign = i >> 31;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0xff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0xff && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 127;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -126;
    else
      *significandParts() |= 0x800000; // integer bit
  }
}